

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

Id __thiscall
dxil_spv::Converter::Impl::get_type_id
          (Impl *this,ComponentType element_type,uint rows,uint cols,bool force_array)

{
  Id IVar1;
  Id IVar2;
  Builder *this_00;
  LoggingCallback p_Var3;
  void *pvVar4;
  bool hasSign;
  int iVar5;
  undefined7 in_register_00000031;
  char buffer [4096];
  char acStack_1028 [4096];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  switch((int)CONCAT71(in_register_00000031,element_type)) {
  case 1:
  case 5:
    iVar5 = 0x20;
    break;
  case 2:
    iVar5 = 0x10;
    goto LAB_001139fe;
  case 3:
    iVar5 = 0x10;
    break;
  case 4:
    iVar5 = 0x20;
    goto LAB_001139fe;
  case 6:
    iVar5 = 0x40;
LAB_001139fe:
    hasSign = true;
    goto LAB_00113a0f;
  case 7:
    iVar5 = 0x40;
    break;
  case 8:
    iVar5 = 0x10;
    goto LAB_00113a60;
  case 9:
    iVar5 = 0x20;
    goto LAB_00113a60;
  case 10:
    iVar5 = 0x40;
LAB_00113a60:
    IVar1 = spv::Builder::makeFloatType(this_00,iVar5);
    goto LAB_00113a65;
  default:
    p_Var3 = get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      get_type_id();
    }
    else {
      builtin_strncpy(acStack_1028 + 0x10,"t type.\n",9);
      builtin_strncpy(acStack_1028,"Unknown componen",0x10);
      pvVar4 = get_thread_log_callback_userdata();
      (*p_Var3)(pvVar4,Error,acStack_1028);
    }
    return 0;
  }
  hasSign = false;
LAB_00113a0f:
  IVar1 = spv::Builder::makeIntegerType(this_00,iVar5,hasSign);
LAB_00113a65:
  if (1 < cols) {
    IVar1 = spv::Builder::makeVectorType(this_00,IVar1,cols);
  }
  if (rows < 2 && !force_array) {
    return IVar1;
  }
  IVar2 = spv::Builder::makeIntegerType(this_00,0x20,false);
  IVar2 = spv::Builder::makeIntConstant(this_00,IVar2,rows,false);
  IVar1 = spv::Builder::makeArrayType(this_00,IVar1,IVar2,0);
  return IVar1;
}

Assistant:

spv::Id Converter::Impl::get_type_id(DXIL::ComponentType element_type, unsigned rows, unsigned cols, bool force_array)
{
	auto &builder = spirv_module.get_builder();

	spv::Id component_type;
	switch (element_type)
	{
	case DXIL::ComponentType::I1:
		// Cannot have bools in I/O interfaces, these are emitted as 32-bit integers.
		component_type = builder.makeUintType(32);
		break;

	case DXIL::ComponentType::I16:
		component_type = builder.makeIntegerType(16, true);
		break;

	case DXIL::ComponentType::U16:
		component_type = builder.makeIntegerType(16, false);
		break;

	case DXIL::ComponentType::I32:
		component_type = builder.makeIntegerType(32, true);
		break;

	case DXIL::ComponentType::U32:
		component_type = builder.makeIntegerType(32, false);
		break;

	case DXIL::ComponentType::I64:
		component_type = builder.makeIntegerType(64, true);
		break;

	case DXIL::ComponentType::U64:
		component_type = builder.makeIntegerType(64, false);
		break;

	case DXIL::ComponentType::F16:
		component_type = builder.makeFloatType(16);
		break;

	case DXIL::ComponentType::F32:
		component_type = builder.makeFloatType(32);
		break;

	case DXIL::ComponentType::F64:
		component_type = builder.makeFloatType(64);
		break;

	default:
		LOGE("Unknown component type.\n");
		return 0;
	}

	if (cols > 1)
		component_type = builder.makeVectorType(component_type, cols);
	if (rows > 1 || force_array)
		component_type = builder.makeArrayType(component_type, builder.makeUintConstant(rows), 0);
	return component_type;
}